

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReportError.cpp
# Opt level: O2

void ReportFatalException
               (ULONG_PTR context,HRESULT exceptionCode,ErrorReason reasonCode,ULONG_PTR scenario)

{
  code *pcVar1;
  BOOL BVar2;
  HANDLE hProcess;
  
  BVar2 = PAL_IsDebuggerPresent();
  if (BVar2 == 0) {
    hProcess = GetCurrentProcess();
    TerminateProcess(hProcess,0x40010004);
    return;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

_NOINLINE
void ReportFatalException(
    __in ULONG_PTR context,
    __in HRESULT exceptionCode,
    __in ErrorReason reasonCode,
    __in ULONG_PTR scenario)
{
    // avoid the error text methods to be optimized out.
    UNREFERENCED_PARAMETER(scenario);

    if (IsDebuggerPresent())
    {
        DebugBreak();
    }

#ifdef DISABLE_SEH
    TerminateProcess(GetCurrentProcess(), (UINT)DBG_TERMINATE_PROCESS);
#else
    void * addressToBlame = _ReturnAddress();
    __try
    {
        ULONG_PTR ExceptionInformation[2];
        ExceptionInformation[0] = (ULONG_PTR)reasonCode;
        ExceptionInformation[1] = (ULONG_PTR)context;
        RaiseException(exceptionCode, EXCEPTION_NONCONTINUABLE, 2, (ULONG_PTR*)ExceptionInformation);
    }
    __except(FatalExceptionFilter(GetExceptionInformation(), addressToBlame))
    {
    }
#endif // DISABLE_SEH
}